

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  int size;
  binary_op_div op;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  int local_374;
  undefined8 *local_360;
  undefined1 (*local_350) [64];
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  
  iVar5 = in_ECX * in_R8D;
  local_374 = 0;
  auVar6 = vbroadcastss_avx512f(ZEXT416(*in_RSI));
  local_360 = in_RDX;
  local_350 = in_RDI;
  for (; local_374 + 0xf < iVar5; local_374 = local_374 + 0x10) {
    auVar7 = vdivps_avx512f(*local_350,auVar6);
    local_440 = auVar7._0_8_;
    uStack_438 = auVar7._8_8_;
    uStack_430 = auVar7._16_8_;
    uStack_428 = auVar7._24_8_;
    uStack_420 = auVar7._32_8_;
    uStack_418 = auVar7._40_8_;
    uStack_410 = auVar7._48_8_;
    uStack_408 = auVar7._56_8_;
    *local_360 = local_440;
    local_360[1] = uStack_438;
    local_360[2] = uStack_430;
    local_360[3] = uStack_428;
    local_360[4] = uStack_420;
    local_360[5] = uStack_418;
    local_360[6] = uStack_410;
    local_360[7] = uStack_408;
    local_350 = local_350 + 1;
    local_360 = local_360 + 8;
  }
  uVar1 = *in_RSI;
  auVar3 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
  auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
  uStack_1d0 = auVar3._0_8_;
  uStack_1c8 = auVar3._8_8_;
  for (; local_374 + 7 < iVar5; local_374 = local_374 + 8) {
    auVar2._16_8_ = uStack_1d0;
    auVar2._0_16_ = auVar4;
    auVar2._24_8_ = uStack_1c8;
    auVar2 = vdivps_avx(*(undefined1 (*) [32])*local_350,auVar2);
    local_4a0 = auVar2._0_8_;
    uStack_498 = auVar2._8_8_;
    uStack_490 = auVar2._16_8_;
    uStack_488 = auVar2._24_8_;
    *local_360 = local_4a0;
    local_360[1] = uStack_498;
    local_360[2] = uStack_490;
    local_360[3] = uStack_488;
    local_350 = (undefined1 (*) [64])(*local_350 + 0x20);
    local_360 = local_360 + 4;
  }
  uVar1 = *in_RSI;
  auVar3._4_4_ = uVar1;
  auVar3._0_4_ = uVar1;
  auVar3._12_4_ = uVar1;
  auVar3._8_4_ = uVar1;
  for (; local_374 + 3 < iVar5; local_374 = local_374 + 4) {
    auVar4 = vdivps_avx(*(undefined1 (*) [16])*local_350,auVar3);
    local_4d0 = auVar4._0_8_;
    uStack_4c8 = auVar4._8_8_;
    *local_360 = local_4d0;
    local_360[1] = uStack_4c8;
    local_350 = (undefined1 (*) [64])(*local_350 + 0x10);
    local_360 = local_360 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}